

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Prog * re2::Compiler::CompileSet(Options *options,Anchor anchor,Regexp *re)

{
  undefined8 re_00;
  ParseFlags flags;
  int64_t max_mem;
  Frag a;
  undefined1 local_110 [8];
  StringPiece sp;
  bool failed;
  Prog *prog;
  Frag local_d4;
  Frag local_cc;
  Frag all;
  undefined1 local_b0 [4];
  ParseFlags pf;
  Compiler c;
  Regexp *re_local;
  Anchor anchor_local;
  Options *options_local;
  
  c._128_8_ = re;
  Compiler((Compiler *)local_b0);
  flags = RE2::Options::ParseFlags(options);
  max_mem = RE2::Options::max_mem(options);
  Setup((Compiler *)local_b0,flags,max_mem,anchor);
  re_00 = c._128_8_;
  Frag::Frag(&local_d4);
  local_cc = Regexp::Walker<re2::Frag>::WalkExponential
                       ((Walker<re2::Frag> *)local_b0,(Regexp *)re_00,local_d4,c.encoding_ * 2);
  Regexp::Decref((Regexp *)c._128_8_);
  if (((byte)c.prog_ & 1) == 0) {
    if (anchor == UNANCHORED) {
      a = DotStar((Compiler *)local_b0);
      local_cc = Cat((Compiler *)local_b0,a,local_cc);
    }
    Prog::set_start((Prog *)c.super_Walker<re2::Frag>._16_8_,local_cc.begin);
    Prog::set_start_unanchored((Prog *)c.super_Walker<re2::Frag>._16_8_,local_cc.begin);
    Prog::set_anchor_start((Prog *)c.super_Walker<re2::Frag>._16_8_,true);
    Prog::set_anchor_end((Prog *)c.super_Walker<re2::Frag>._16_8_,true);
    options_local = (Options *)Finish((Compiler *)local_b0);
    if ((Prog *)options_local == (Prog *)0x0) {
      options_local = (Options *)0x0;
    }
    else {
      StringPiece::StringPiece((StringPiece *)local_110,"hello, world");
      Prog::SearchDFA((Prog *)options_local,(StringPiece *)local_110,(StringPiece *)local_110,
                      kAnchored,kManyMatch,(StringPiece *)0x0,(bool *)&sp.field_0xf,
                      (vector<int,_std::allocator<int>_> *)0x0);
      if ((sp._15_1_ & 1) != 0) {
        if ((Prog *)options_local != (Prog *)0x0) {
          Prog::~Prog((Prog *)options_local);
          operator_delete(options_local);
        }
        options_local = (Options *)0x0;
      }
    }
  }
  else {
    options_local = (Options *)0x0;
  }
  ~Compiler((Compiler *)local_b0);
  return (Prog *)options_local;
}

Assistant:

Prog* Compiler::CompileSet(const RE2::Options& options, RE2::Anchor anchor,
                           Regexp* re) {
  Compiler c;

  Regexp::ParseFlags pf = static_cast<Regexp::ParseFlags>(options.ParseFlags());
  c.Setup(pf, options.max_mem(), anchor);

  // Compile alternation of fragments.
  Frag all = c.WalkExponential(re, Frag(), 2*c.max_inst_);
  re->Decref();
  if (c.failed_)
    return NULL;

  if (anchor == RE2::UNANCHORED) {
    // The trailing .* was added while handling kRegexpHaveMatch.
    // We just have to add the leading one.
    all = c.Cat(c.DotStar(), all);
  }

  c.prog_->set_start(all.begin);
  c.prog_->set_start_unanchored(all.begin);
  c.prog_->set_anchor_start(true);
  c.prog_->set_anchor_end(true);

  Prog* prog = c.Finish();
  if (prog == NULL)
    return NULL;

  // Make sure DFA has enough memory to operate,
  // since we're not going to fall back to the NFA.
  bool failed;
  StringPiece sp = "hello, world";
  prog->SearchDFA(sp, sp, Prog::kAnchored, Prog::kManyMatch,
                  NULL, &failed, NULL);
  if (failed) {
    delete prog;
    return NULL;
  }

  return prog;
}